

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O1

void Abc_QuickSort2Dec_rec(word *pData,int l,int r)

{
  word wVar1;
  word wVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
LAB_00499269:
  uVar4 = r - l;
  if (uVar4 != 0 && l <= r) {
    if (9 < (int)uVar4) {
      wVar1 = pData[r];
      uVar9 = (ulong)(l - 1);
      uVar6 = (ulong)(uint)r;
      do {
        uVar9 = (long)(int)uVar9;
        do {
          uVar7 = uVar9;
          wVar2 = pData[uVar7 + 1];
          uVar9 = uVar7 + 1;
        } while ((uint)wVar1 < (uint)wVar2);
        uVar5 = (long)(int)uVar6;
        do {
          lVar3 = uVar5 - 1;
          uVar6 = uVar5 - 1;
          if (l + 1 == (int)uVar5) break;
          uVar5 = uVar6;
        } while ((uint)pData[lVar3] < (uint)wVar1);
        if ((long)uVar6 <= (long)uVar9) goto LAB_004992bb;
        pData[uVar9] = pData[lVar3];
        pData[uVar6] = wVar2;
      } while( true );
    }
    if (0 < (int)uVar4) {
      uVar6 = 1;
      uVar9 = 0;
      do {
        uVar5 = uVar9 & 0xffffffff;
        uVar7 = uVar6;
        do {
          uVar8 = (uint)uVar7;
          if ((uint)pData[(long)l + uVar7] <= (uint)pData[(long)l + (long)(int)(uint)uVar5]) {
            uVar8 = (uint)uVar5;
          }
          uVar7 = uVar7 + 1;
          uVar5 = (ulong)uVar8;
        } while (uVar4 + 1 != uVar7);
        wVar1 = pData[(long)l + uVar9];
        pData[(long)l + uVar9] = pData[(long)l + (long)(int)uVar8];
        uVar9 = uVar9 + 1;
        pData[(long)l + (long)(int)uVar8] = wVar1;
        uVar6 = uVar6 + 1;
      } while (uVar9 != uVar4);
    }
  }
  return;
LAB_004992bb:
  pData[uVar9] = pData[r];
  pData[r] = wVar2;
  Abc_QuickSort2Dec_rec(pData,l,(int)uVar7);
  l = (int)uVar7 + 2;
  goto LAB_00499269;
}

Assistant:

void Abc_QuickSort2Dec_rec( word * pData, int l, int r )
{
    word v = pData[r];
    int i = l-1, j = r;
    if ( l >= r )
        return;
    assert( l < r );
    if ( r - l < 10 )
    {
        Abc_SelectSortDec( pData + l, r - l + 1 );
        return;
    }
    while ( 1 )
    {
        while ( (unsigned)pData[++i] > (unsigned)v );
        while ( (unsigned)v > (unsigned)pData[--j] )
            if ( j == l )
                break;
        if ( i >= j )
            break;
        ABC_SWAP( word, pData[i], pData[j] );
    }
    ABC_SWAP( word, pData[i], pData[r] ); 
    Abc_QuickSort2Dec_rec( pData, l, i-1 );
    Abc_QuickSort2Dec_rec( pData, i+1, r );
}